

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O0

string * ZXing::OneD::DataBar::DecodeAI0139yx_abi_cxx11_(BitArrayView *bits,char y)

{
  int iVar1;
  ulong uVar2;
  undefined1 in_DL;
  string *in_RDI;
  string trailer;
  BitArrayView *in_stack_00000078;
  string buffer;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  BitArrayView *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  string local_68 [48];
  string local_38 [32];
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  int val;
  
  val = CONCAT13(in_DL,in_stack_ffffffffffffffec);
  BitArrayView::skipBits(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  DecodeAI01GTIN_abi_cxx11_
            ((BitArrayView *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::__cxx11::string::append((char *)local_38);
  std::__cxx11::string::push_back((char)local_38);
  iVar1 = BitArrayView::readBits
                    ((BitArrayView *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c);
  std::__cxx11::to_string(in_stack_ffffffffffffff7c);
  std::__cxx11::string::append(local_38);
  std::__cxx11::string::~string(local_68);
  if ((char)((uint)val >> 0x18) == '3') {
    BitArrayView::readBits
              ((BitArrayView *)CONCAT44(iVar1,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c);
    ToString<int,void>(val,in_stack_ffffffffffffffe8);
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  DecodeGeneralPurposeBits_abi_cxx11_(in_stack_00000078);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

static std::string DecodeAI0139yx(BitArrayView& bits, char y)
{
	bits.skipBits(2); // Variable length symbol bit field

	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append("39");
	buffer.push_back(y);
	buffer.append(std::to_string(bits.readBits(2)));

	if (y == '3')
		buffer.append(ToString(bits.readBits(10), 3));

	auto trailer = DecodeGeneralPurposeBits(bits);
	if (trailer.empty())
		return {};

	return buffer + trailer;
}